

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O2

bool __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::nodeInSearchRange(KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                    *this,int *searchMin,int *searchMax,Node *node)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if ((uVar2 == 5) || (node->value[uVar2] < searchMin[uVar2])) break;
    uVar1 = uVar2 + 1;
  } while (node->value[uVar2] <= searchMax[uVar2]);
  return 4 < uVar2;
}

Assistant:

bool nodeInSearchRange(const T * const searchMin, const T * const searchMax, Node * const node) const {
			for (int d = 0; d < dim; d++) {
				if (LESS()(node->value, searchMin, d)
					|| LESS()(searchMax, node->value, d)) {
					return false;
				}
			}
			return true;
		}